

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O1

pos sel_spread_half(Terminal *term,pos p,wchar_t dir)

{
  anon_enum_32 aVar1;
  bool bVar2;
  termchar *ptVar3;
  short sVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  termline *line;
  termline *ptVar8;
  termchar *ptVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  
  wVar5 = sblines(term);
  uVar15 = 0;
  line = lineptr(term,p.y,L'᪜',L'\0');
  aVar1 = term->selmode;
  if (aVar1 == DRAGGING) {
    if (dir != L'\xffffffff') {
      uVar15 = (ulong)(uint)(term->cols + L'\xffffffff');
    }
  }
  else {
    uVar15 = (ulong)p >> 0x20;
    if (aVar1 == ABOUT_TO) {
      if ((p.x < L'\x01') || (line->chars[uVar15].chr != 0xdfff)) {
        ptVar9 = line->chars + ((long)p >> 0x20);
      }
      else {
        ptVar9 = line->chars + (uint)(p.x + L'\xffffffff');
      }
      wVar6 = wordtype(term,(wchar_t)ptVar9->chr);
      sVar4 = (short)wVar6;
      if (dir == L'\x01') {
        do {
          wVar5 = term->cols + L'\xfffffffd';
          if (line->trusted == false) {
            wVar5 = term->cols;
          }
          iVar12 = ((int)(short)(*(uint *)line << 10) >> 0xf) + wVar5;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          iVar14 = (int)uVar15;
          if (iVar14 < iVar12 + -1) {
            uVar10 = iVar14 + 1;
            if ((iVar14 < 0) || (line->chars[uVar10].chr != 0xdfff)) {
              ptVar9 = line->chars + (int)uVar10;
            }
            else {
              ptVar9 = line->chars + uVar15;
            }
            wVar7 = wordtype(term,(wchar_t)ptVar9->chr);
            iVar12 = 6;
joined_r0x001123bd:
            if (wVar7 == sVar4) {
              iVar12 = 0;
              uVar15 = (ulong)uVar10;
            }
          }
          else {
            iVar12 = 6;
            if ((*(uint *)line & 0x10) != 0) {
              wVar5 = p.y;
              wVar6 = wVar5 + L'\x01';
              if (wVar6 < term->rows) {
                ptVar8 = lineptr(term,wVar6,L'᫁',L'\0');
                wVar7 = wordtype(term,(wchar_t)ptVar8->chars->chr);
                if (wVar7 == sVar4) {
                  iVar12 = 0;
                  if (line->temporary == true) {
                    freetermline(line);
                  }
                  uVar15 = 0;
                  line = ptVar8;
                  wVar5 = wVar6;
                }
                else {
                  iVar12 = 6;
                  if (ptVar8->temporary == true) {
                    freetermline(ptVar8);
                  }
                }
                p.x = L'\0';
                p.y = wVar5;
                uVar10 = (uint)uVar15;
                goto joined_r0x001123bd;
              }
            }
          }
        } while (iVar12 == 0);
      }
      else {
        do {
          lVar18 = uVar15 * 0x20 + -0x40;
          uVar10 = (uint)uVar15;
          while( true ) {
            uVar11 = uVar10;
            uVar10 = uVar11 - 1;
            uVar15 = (ulong)uVar11;
            if ((int)uVar11 < 1) break;
            if ((uVar10 == 0) || (line->chars[uVar10].chr != 0xdfff)) {
              ptVar9 = line->chars + uVar10;
            }
            else {
              ptVar9 = (termchar *)((long)&line->chars->chr + lVar18);
            }
            wVar6 = wordtype(term,(wchar_t)ptVar9->chr);
            lVar18 = lVar18 + -0x20;
            if (wVar6 != sVar4) {
              uVar15 = (ulong)uVar11;
              goto LAB_00112521;
            }
          }
          bVar2 = false;
          wVar6 = p.y;
          if (wVar6 != -wVar5 && SBORROW4(wVar6,-wVar5) == wVar6 + wVar5 < 0) {
            ptVar8 = lineptr(term,wVar6 + L'\xffffffff',L'᫜',L'\0');
            wVar7 = term->cols + L'\xfffffffd';
            if (ptVar8->trusted == false) {
              wVar7 = term->cols;
            }
            uVar11 = ((int)(short)(ptVar8->lattr << 10) >> 0xf) + wVar7;
            uVar10 = 0;
            if (0 < (int)uVar11) {
              uVar10 = uVar11;
            }
            if ((ptVar8->lattr & 0x10) != 0) {
              uVar17 = uVar10 - 1;
              if (((int)uVar11 < 2) || (ptVar8->chars[uVar17].chr != 0xdfff)) {
                ptVar9 = ptVar8->chars + (int)uVar17;
              }
              else {
                ptVar9 = ptVar8->chars + ((ulong)uVar10 - 2);
              }
              wVar7 = wordtype(term,(wchar_t)ptVar9->chr);
              if (wVar7 == sVar4) {
                uVar15 = (ulong)uVar17;
                bVar2 = true;
                if (line->temporary == true) {
                  freetermline(line);
                }
                p.x = L'\0';
                p.y = wVar6 + L'\xffffffff';
                line = ptVar8;
                goto LAB_0011250a;
              }
              if (ptVar8->temporary == true) {
                freetermline(ptVar8);
              }
            }
            bVar2 = false;
          }
LAB_0011250a:
        } while (bVar2);
      }
    }
    else if ((aVar1 == LEXICOGRAPHIC) && ((line->lattr & 0x10) == 0)) {
      wVar5 = term->cols;
      wVar6 = wVar5 + L'\xfffffffd';
      if (line->trusted == false) {
        wVar6 = wVar5;
      }
      uVar10 = ((int)(short)(line->lattr << 10) >> 0xf) + wVar6;
      uVar13 = 0;
      if (0 < (int)uVar10) {
        uVar13 = (ulong)uVar10;
      }
      ptVar9 = line->chars + uVar13;
      lVar18 = uVar13 * -0x20;
      do {
        lVar16 = lVar18;
        if ((ptVar9 <= line->chars) ||
           (ptVar9[-1].chr != 0x20 && ((uint)ptVar9[-1].chr & 0xfffffcff) != 0xd820)) break;
        ptVar3 = ptVar9 + -1;
        ptVar9 = ptVar9 + -1;
        lVar18 = lVar16 + 0x20;
      } while (ptVar3->cc_next == L'\0');
      uVar13 = (long)(((ulong)((long)wVar5 * 0x20 + lVar16 != 0) * 0x20 - lVar16) + -0x20) >> 5;
      if ((long)uVar13 <= (long)p >> 0x20) {
        if (dir == L'\xffffffff') {
          uVar15 = uVar13 & 0xffffffff;
        }
        else {
          uVar15 = (ulong)(uint)(wVar5 + L'\xffffffff');
        }
      }
    }
  }
LAB_00112521:
  if (line->temporary == true) {
    freetermline(line);
  }
  return (pos)((ulong)p & 0xffffffff | uVar15 << 0x20);
}

Assistant:

static pos sel_spread_half(Terminal *term, pos p, int dir)
{
    termline *ldata;
    short wvalue;
    int topy = -sblines(term);

    ldata = lineptr(p.y);

    switch (term->selmode) {
      case SM_CHAR:
        /*
         * In this mode, every character is a separate unit, except
         * for runs of spaces at the end of a non-wrapping line.
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            termchar *q = ldata->chars + line_cols(term, ldata);
            while (q > ldata->chars &&
                   IS_SPACE_CHR(q[-1].chr) && !q[-1].cc_next)
                q--;
            if (q == ldata->chars + term->cols)
                q--;
            if (p.x >= q - ldata->chars)
                p.x = (dir == -1 ? q - ldata->chars : term->cols - 1);
        }
        break;
      case SM_WORD:
        /*
         * In this mode, the units are maximal runs of characters
         * whose `wordness' has the same value.
         */
        wvalue = wordtype(term, UCSGET(ldata->chars, p.x));
        if (dir == +1) {
            while (1) {
                int maxcols = line_cols(term, ldata);
                if (p.x < maxcols-1) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x+1)) == wvalue)
                        p.x++;
                    else
                        break;
                } else {
                    if (p.y+1 < term->rows &&
                        (ldata->lattr & LATTR_WRAPPED)) {
                        termline *ldata2;
                        ldata2 = lineptr(p.y+1);
                        if (wordtype(term, UCSGET(ldata2->chars, 0))
                            == wvalue) {
                            p.x = 0;
                            p.y++;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        } else {
            while (1) {
                if (p.x > 0) {
                    if (wordtype(term, UCSGET(ldata->chars, p.x-1)) == wvalue)
                        p.x--;
                    else
                        break;
                } else {
                    termline *ldata2;
                    int maxcols;
                    if (p.y <= topy)
                        break;
                    ldata2 = lineptr(p.y-1);
                    maxcols = line_cols(term, ldata2);
                    if (ldata2->lattr & LATTR_WRAPPED) {
                        if (wordtype(term, UCSGET(ldata2->chars, maxcols-1))
                            == wvalue) {
                            p.x = maxcols-1;
                            p.y--;
                            unlineptr(ldata);
                            ldata = ldata2;
                        } else {
                            unlineptr(ldata2);
                            break;
                        }
                    } else
                        break;
                }
            }
        }
        break;
      case SM_LINE:
        /*
         * In this mode, every line is a unit.
         */
        p.x = (dir == -1 ? 0 : term->cols - 1);
        break;
    }

    unlineptr(ldata);
    return p;
}